

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  ulong uVar1;
  Column *pCVar2;
  ostream *poVar3;
  Column local_60;
  long local_28;
  size_t idx;
  size_t indent_local;
  string *_string_local;
  ConsoleReporter *this_local;
  
  idx = indent;
  indent_local = (size_t)_string;
  _string_local = (string *)this;
  uVar1 = std::__cxx11::string::find((char *)_string,0x4163b1);
  if ((uVar1 == 0xffffffffffffffff) || (0x13 < uVar1)) {
    local_28 = 0;
  }
  else {
    local_28 = uVar1 + 2;
  }
  poVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  TextFlow::Column::Column(&local_60,(string *)indent_local);
  pCVar2 = TextFlow::Column::indent(&local_60,idx + local_28);
  pCVar2 = TextFlow::Column::initialIndent(pCVar2,idx);
  poVar3 = TextFlow::operator<<(poVar3,pCVar2);
  std::operator<<(poVar3,'\n');
  TextFlow::Column::~Column(&local_60);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    // We want to get a bit fancy with line breaking here, so that subsequent
    // lines start after ":" if one is present, e.g.
    // ```
    // blablabla: Fancy
    //            linebreaking
    // ```
    // but we also want to avoid problems with overly long indentation causing
    // the text to take up too many lines, e.g.
    // ```
    // blablabla: F
    //            a
    //            n
    //            c
    //            y
    //            .
    //            .
    //            .
    // ```
    // So we limit the prefix indentation check to first quarter of the possible
    // width
    std::size_t idx = _string.find( ": " );
    if ( idx != std::string::npos && idx < CATCH_CONFIG_CONSOLE_WIDTH / 4 ) {
        idx += 2;
    } else {
        idx = 0;
    }
    m_stream << TextFlow::Column( _string )
                  .indent( indent + idx )
                  .initialIndent( indent )
           << '\n';
}